

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrlib.c
# Opt level: O2

int binstrrcaseless(bstring b1,int pos,bstring b2)

{
  byte bVar1;
  byte bVar2;
  uint uVar3;
  uchar *puVar4;
  uint uVar5;
  __int32_t **pp_Var6;
  int iVar7;
  uint uVar8;
  long lVar9;
  uchar *puVar10;
  
  iVar7 = -1;
  if (((((b1 != (bstring)0x0) && (puVar10 = b1->data, puVar10 != (uchar *)0x0)) &&
       (uVar5 = b1->slen, b2 != (bstring)0x0 && -1 < (int)uVar5)) &&
      ((puVar4 = b2->data, puVar4 != (uchar *)0x0 && (uVar3 = b2->slen, -1 < (int)uVar3)))) &&
     (iVar7 = pos, uVar5 != pos || uVar3 != 0)) {
    if (uVar5 < (uint)pos) {
      iVar7 = -1;
    }
    if (((uVar5 >= (uint)pos && uVar3 != 0) &&
        (iVar7 = 0, (pos != 0 || puVar10 != puVar4) || uVar5 < uVar3)) &&
       (uVar5 = uVar5 - uVar3, iVar7 = -1, -1 < (int)uVar5)) {
      if (uVar5 < (uint)pos) {
        pos = uVar5;
      }
      puVar10 = puVar10 + pos;
LAB_001148de:
      lVar9 = 0;
      do {
        bVar1 = puVar4[lVar9];
        uVar5 = (uint)bVar1;
        bVar2 = puVar10[lVar9];
        uVar8 = (uint)bVar2;
        if (bVar1 != bVar2) {
          if (-1 < (char)bVar1) {
            pp_Var6 = __ctype_tolower_loc();
            uVar5 = (*pp_Var6)[bVar1];
          }
          if (-1 < (char)bVar2) {
            pp_Var6 = __ctype_tolower_loc();
            uVar8 = (*pp_Var6)[bVar2];
          }
          if (uVar5 != uVar8) goto LAB_00114926;
        }
        lVar9 = lVar9 + 1;
        if ((int)uVar3 <= (int)lVar9) {
          return pos;
        }
      } while( true );
    }
  }
  return iVar7;
LAB_00114926:
  if (pos < 1) {
    return -1;
  }
  pos = pos - 1;
  puVar10 = puVar10 + -1;
  goto LAB_001148de;
}

Assistant:

int binstrrcaseless (const bstring b1, int pos, const bstring b2) {
int j, i, l;
unsigned char * d0, * d1;

	if (b1 == NULL || b1->data == NULL || b1->slen < 0 ||
	    b2 == NULL || b2->data == NULL || b2->slen < 0) return BSTR_ERR;
	if (b1->slen == pos && b2->slen == 0) return pos;
	if (b1->slen < pos || pos < 0) return BSTR_ERR;
	if (b2->slen == 0) return pos;

	/* Obvious alias case */
	if (b1->data == b2->data && pos == 0 && b2->slen <= b1->slen) return 0;

	i = pos;
	if ((l = b1->slen - b2->slen) < 0) return BSTR_ERR;

	/* If no space to find such a string then snap back */
	if (l + 1 <= i) i = l;
	j = 0;

	d0 = b2->data;
	d1 = b1->data;
	l  = b2->slen;

	for (;;) {
		if (d0[j] == d1[i + j] || downcase (d0[j]) == downcase (d1[i + j])) {
			j ++;
			if (j >= l) return i;
		} else {
			i --;
			if (i < 0) break;
			j=0;
		}
	}

	return BSTR_ERR;
}